

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_bagwell<unsigned_char_*,_16U> *buckets)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint j;
  long lVar4;
  pointer pppuVar5;
  ushort uVar6;
  uchar **ppuVar7;
  pointer pppuVar8;
  vector_bagwell<unsigned_char_*,_16U> *pvVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  uchar **ppuVar12;
  byte bVar13;
  byte bVar14;
  ulong n_00;
  uint i_1;
  long lVar15;
  uint j_1;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar7 = strings;
      do {
        iVar3 = (int)n;
        n = (size_t)(iVar3 - 1);
        puVar1 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar12 = ppuVar7; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          puVar2 = ppuVar12[-1];
          bVar13 = puVar2[depth];
          bVar14 = puVar1[depth];
          if ((bVar13 != 0) && (lVar4 = depth + 1, bVar13 == bVar14)) {
            do {
              bVar13 = puVar2[lVar4];
              bVar14 = puVar1[lVar4];
              if (bVar13 == 0) break;
              lVar4 = lVar4 + 1;
            } while (bVar13 == bVar14);
          }
          if (bVar13 <= bVar14) break;
          *ppuVar12 = puVar2;
        }
        *ppuVar12 = puVar1;
      } while (2 < iVar3);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      ppuVar7 = strings;
      do {
        lVar4 = 0;
        do {
          *(uchar *)((long)local_238 + lVar4) = ppuVar7[lVar4][depth];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
        lVar4 = 0;
        ppuVar12 = ppuVar7;
        do {
          vector_bagwell<unsigned_char_*,_16U>::push_back
                    (buckets + *(byte *)((long)local_238 + lVar4),ppuVar12);
          lVar4 = lVar4 + 1;
          ppuVar12 = ppuVar12 + 1;
        } while (lVar4 != 0x20);
        uVar10 = uVar10 + 0x20;
        ppuVar7 = ppuVar7 + 0x20;
      } while (uVar10 < (n & 0xffffffffffffffe0));
    }
    lVar4 = n - uVar10;
    if (uVar10 <= n && lVar4 != 0) {
      ppuVar7 = strings + uVar10;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + (*ppuVar7)[depth],ppuVar7);
        ppuVar7 = ppuVar7 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    lVar4 = 0;
    pvVar9 = buckets;
    do {
      if (pvVar9->_insertpos == (uchar **)0x0) {
        uVar6 = 0;
      }
      else {
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        uVar6 = (ushort)((((int)pvVar9->_insertpos +
                          (1 << ((char)((uint)((int)pppuVar5 -
                                              *(int *)&(pvVar9->_index_block).
                                                                                                              
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                 3U & 0x1f)) * 8) - *(int *)(pppuVar5 + -1)) - 0x80U >> 3);
      }
      local_238[lVar4] = uVar6;
      lVar4 = lVar4 + 1;
      pvVar9 = pvVar9 + 1;
    } while (lVar4 != 0x100);
    lVar15 = 0;
    lVar4 = 0;
    do {
      uVar6 = local_238[lVar15];
      if ((ulong)uVar6 != 0) {
        pvVar9 = buckets + lVar15;
        ppuVar7 = strings + lVar4;
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pppuVar8 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (8 < (ulong)((long)pppuVar8 - (long)pppuVar5)) {
          lVar11 = 0x10;
          uVar10 = 1;
          do {
            if (lVar11 != 0) {
              memmove(ppuVar7,pppuVar5[uVar10 - 1],lVar11 * 8);
            }
            ppuVar7 = ppuVar7 + lVar11;
            lVar11 = lVar11 * 2;
            uVar10 = uVar10 + 1;
            pppuVar5 = (pvVar9->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pppuVar8 = (pvVar9->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          } while (uVar10 < (ulong)((long)pppuVar8 - (long)pppuVar5 >> 3));
        }
        __n = (long)pvVar9->_insertpos - (long)pppuVar8[-1];
        if (__n != 0) {
          memmove(ppuVar7,pppuVar8[-1],__n);
        }
        lVar4 = lVar4 + (ulong)uVar6;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x100);
    lVar4 = 0;
    do {
      vector_bagwell<unsigned_char_*,_16U>::clear
                ((vector_bagwell<unsigned_char_*,_16U> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0x2800);
    uVar10 = (ulong)local_238[0];
    lVar4 = 1;
    do {
      n_00 = (ulong)local_238[lVar4];
      if (n_00 != 0) {
        msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_short>
                  (strings + uVar10,n_00,depth + 1,buckets);
        uVar10 = uVar10 + n_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}